

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcValue::assertStruct(XmlRpcValue *this)

{
  void *__s;
  undefined8 uVar1;
  int *in_RDI;
  string *message;
  XmlRpcException *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (*in_RDI == 0) {
    *in_RDI = 8;
    __s = operator_new(0x30);
    memset(__s,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
           *)0x56b41b);
    *(void **)(in_RDI + 2) = __s;
  }
  else if (*in_RDI != 8) {
    uVar1 = __cxa_allocate_exception(0x28);
    message = (string *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    XmlRpcException::XmlRpcException(in_stack_ffffffffffffffb0,message,(int)((ulong)uVar1 >> 0x20));
    __cxa_throw(uVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertStruct()
  {
    if (_type == TypeInvalid) {
      _type = TypeStruct;
      _value.asStruct = new ValueStruct();
    } else if (_type != TypeStruct)
      throw XmlRpcException("type error: expected a struct");
  }